

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_host.c
# Opt level: O2

void test_distributed_fft_3d_compare(void)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  kiss_fft_cpx *fin;
  kiss_fft_cpx *fout;
  kiss_fftnd_cfg st;
  void *__ptr;
  void *__ptr_00;
  uint uVar5;
  uint uVar6;
  float *pfVar7;
  kiss_fft_cpx *pkVar8;
  long lVar9;
  float *pfVar10;
  ulong uVar11;
  dfft_plan *pdVar12;
  undefined8 uVar13;
  ulong uVar14;
  int **ppiVar15;
  ulong uVar16;
  kiss_fft_cpx *pkVar17;
  ulong uVar18;
  undefined1 *puVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  byte bVar26;
  float fVar27;
  float fVar28;
  undefined4 uVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  int *local_328;
  undefined4 local_320;
  undefined4 local_318;
  undefined4 local_310;
  undefined *local_308;
  int *local_300;
  int s;
  int *local_1e8;
  uint local_1e0;
  int p;
  ulong local_1d8;
  ulong local_1d0;
  int *local_1c8;
  kiss_fft_cpx *local_1c0;
  float *local_1b8;
  int pidx [3];
  dfft_plan plan;
  
  bVar26 = 0;
  MPI_Comm_size(&ompi_mpi_comm_world,&p);
  MPI_Comm_rank(&ompi_mpi_comm_world,&s);
  local_1e8 = (int *)malloc(0xc);
  fVar27 = powf((float)p,0.33333334);
  uVar6 = 1;
  do {
    uVar5 = uVar6;
    uVar6 = uVar5 * 2;
  } while ((int)uVar5 < (int)(fVar27 + 0.5));
  if (s == 0) {
    printf("Processor grid: ");
  }
  iVar20 = 1;
  piVar3 = local_1e8;
  for (lVar21 = 0; lVar21 != 2; lVar21 = lVar21 + 1) {
    uVar6 = 1;
    if ((int)(iVar20 * uVar5) <= p) {
      uVar6 = uVar5;
    }
    piVar3[lVar21] = uVar6;
    if (s == 0) {
      printf("%d x ",(ulong)uVar6);
      piVar3 = local_1e8;
    }
    iVar20 = iVar20 * uVar6;
  }
  uVar4 = (long)p / (long)iVar20;
  iVar2 = (int)uVar4;
  piVar3[2] = iVar2;
  if (s == 0) {
    printf("%d\n",uVar4 & 0xffffffff,(long)p % (long)iVar20 & 0xffffffff);
    piVar3 = local_1e8;
  }
  iVar20 = s;
  for (uVar6 = 2; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
    iVar1 = piVar3[uVar6];
    pidx[uVar6] = iVar20 % iVar1;
    iVar20 = iVar20 / iVar1;
  }
  piVar3 = (int *)malloc(0xc);
  uVar4 = (long)*local_1e8 * 4;
  *piVar3 = (int)uVar4;
  local_1d0 = (long)local_1e8[1] << 3;
  piVar3[1] = (int)local_1d0;
  uVar6 = iVar2 * 0x10;
  piVar3[2] = uVar6;
  for (lVar21 = 0; lVar21 != 2; lVar21 = lVar21 + 1) {
    if (s == 0) {
      printf("%d x ",(ulong)(uint)piVar3[lVar21]);
    }
  }
  local_1c8 = piVar3;
  if (s == 0) {
    printf("%d matrix\n",(ulong)uVar6);
  }
  uVar14 = local_1d0;
  lVar22 = (long)(int)uVar6;
  local_1c0 = (kiss_fft_cpx *)(uVar4 * local_1d0 * 8 * lVar22);
  local_1d8 = uVar4;
  fin = (kiss_fft_cpx *)malloc((size_t)local_1c0);
  srand(0x3039);
  local_1e0 = uVar6;
  fVar27 = logf((float)(int)((int)uVar14 * (int)uVar4 * uVar6));
  fVar27 = (fVar27 * -0.5) / 0.6931472 + 7.0;
  fVar28 = powf(10.0,-fVar27);
  dVar30 = (double)fVar28;
  printf("Testing with %f sig digits, rel precision %f, abs precision %f\n",SUB84((double)fVar27,0),
         dVar30,dVar30);
  pfVar10 = &fin->i;
  lVar21 = lVar22 * uVar14;
  for (lVar23 = 0; lVar23 < (long)local_1d8; lVar23 = lVar23 + 1) {
    local_1b8 = pfVar10;
    for (lVar25 = 0; lVar25 < (long)local_1d0; lVar25 = lVar25 + 1) {
      for (lVar9 = 0; lVar9 < lVar22; lVar9 = lVar9 + 1) {
        iVar20 = rand();
        pfVar10[lVar9 * 2 + -1] = (float)iVar20 * 4.656613e-10;
        iVar20 = rand();
        pfVar10[lVar9 * 2] = (float)iVar20 * 4.656613e-10;
      }
      pfVar10 = pfVar10 + lVar22 * 2;
    }
    pfVar10 = local_1b8 + lVar21 * 2;
  }
  fout = (kiss_fft_cpx *)malloc((size_t)local_1c0);
  uVar4 = local_1d8;
  st = kiss_fftnd_alloc(local_1c8,3,0,(void *)0x0,(size_t *)0x0);
  kiss_fftnd(st,fin,fout);
  __ptr = malloc(0x1000);
  uVar14 = 0;
  if (0 < (int)local_1e0) {
    uVar14 = (ulong)local_1e0;
  }
  uVar16 = 0;
  if (0 < (int)local_1d0) {
    uVar16 = local_1d0 & 0xffffffff;
  }
  puVar19 = (undefined1 *)0x0;
  if (0 < (int)uVar4) {
    puVar19 = (undefined1 *)(uVar4 & 0xffffffff);
  }
  pfVar10 = (float *)0x0;
  pkVar8 = fin;
  uVar4 = (ulong)(uint)-(pidx[0] * 0x200 + pidx[1] * 0x80 + pidx[2] * 0x10);
  while (uVar24 = uVar4, pkVar17 = pkVar8, pfVar7 = pfVar10, pfVar7 != (float *)puVar19) {
    uVar4 = uVar24;
    pkVar8 = pkVar17;
    for (uVar18 = 0; uVar18 != uVar16; uVar18 = uVar18 + 1) {
      for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
        if (((((long)uVar18 < (long)((int)((long)pidx[1] * 8) + 8) &&
              (long)pidx[1] * 8 <= (long)uVar18) &&
              ((long)pfVar7 < (long)((int)((long)pidx[0] << 2) + 4) &&
              (long)pidx[0] << 2 <= (long)pfVar7)) && ((long)pidx[2] * 0x10 <= (long)uVar11)) &&
           ((long)uVar11 < (long)((int)((long)pidx[2] * 0x10) + 0x10))) {
          *(kiss_fft_cpx *)((long)__ptr + (long)((int)uVar4 + (int)uVar11) * 8) = pkVar8[uVar11];
        }
      }
      pkVar8 = pkVar8 + lVar22;
      uVar4 = uVar4 + 0x10;
    }
    pkVar8 = pkVar17 + lVar21;
    uVar4 = uVar24 + 0x80;
    local_1d8 = uVar24;
    local_1c0 = pkVar17;
    local_1b8 = pfVar7;
    pfVar10 = (float *)((long)pfVar7 + 1);
  }
  __ptr_00 = malloc(0x1000);
  local_300 = proc_map;
  local_308 = &ompi_mpi_comm_world;
  local_328 = pidx;
  local_310 = 0;
  local_318 = 0;
  local_320 = 0;
  uVar4 = 0;
  dfft_create_plan(&plan,3,local_1c8,0,0,local_1e8);
  pdVar12 = &plan;
  ppiVar15 = &local_328;
  for (lVar21 = 0x26; lVar21 != 0; lVar21 = lVar21 + -1) {
    *ppiVar15 = (int *)*(undefined8 *)pdVar12;
    pdVar12 = (dfft_plan *)((long)pdVar12 + (ulong)bVar26 * -0x10 + 8);
    ppiVar15 = ppiVar15 + (ulong)bVar26 * -2 + 1;
  }
  dfft_execute(__ptr,__ptr_00,0);
  do {
    if (uVar4 == 0x200) {
      free(fin);
      free(fout);
      free(__ptr_00);
      free(__ptr);
      free(local_1c8);
      pdVar12 = &plan;
      ppiVar15 = &local_328;
      for (lVar21 = 0x26; lVar21 != 0; lVar21 = lVar21 + -1) {
        *ppiVar15 = (int *)*(undefined8 *)pdVar12;
        pdVar12 = (dfft_plan *)((long)pdVar12 + (ulong)bVar26 * -0x10 + 8);
        ppiVar15 = ppiVar15 + (ulong)bVar26 * -2 + 1;
      }
      dfft_destroy_plan();
      return;
    }
    fVar27 = *(float *)((long)__ptr_00 + uVar4 * 8);
    fVar28 = *(float *)((long)__ptr_00 + uVar4 * 8 + 4);
    dVar32 = (double)fVar27;
    uVar29 = SUB84(dVar32,0);
    iVar20 = (((uint)(uVar4 >> 7) & 0x1ffffff | pidx[0] << 2) * (int)local_1d0 +
             ((uint)(uVar4 >> 4) & 7 | pidx[1] << 3)) * local_1e0 +
             ((uint)uVar4 & 0xf | pidx[2] << 4);
    dVar31 = (double)fout[iVar20].r;
    dVar34 = (double)fout[iVar20].i;
    if (dVar30 <= ABS(dVar31)) {
      dVar33 = (dVar30 + 1.0) * dVar32;
      dVar32 = (1.0 - dVar30) * dVar32;
      if ((((0.0 <= fVar27) && (dVar31 <= dVar33)) && (dVar32 <= dVar31)) ||
         (((fVar27 < 0.0 && (dVar33 <= dVar31)) && (dVar31 <= dVar32)))) goto LAB_00102b3b;
      uVar13 = 0x239;
LAB_00102c4c:
      printf("Test failed at line %d! %f != %f (rel tol: %f)\n",uVar29,dVar31,uVar13);
      goto LAB_00102c53;
    }
    if (dVar30 + dVar30 < ABS(dVar32)) {
      uVar13 = 0x235;
LAB_00102c20:
      printf("Test failed at line %d! abs(%f) >= %f \n",uVar13);
LAB_00102c53:
      exit(1);
    }
LAB_00102b3b:
    dVar32 = (double)fVar28;
    uVar29 = SUB84(dVar32,0);
    if (dVar30 <= ABS(dVar34)) {
      dVar31 = (dVar30 + 1.0) * dVar32;
      dVar32 = (1.0 - dVar30) * dVar32;
      if ((((fVar28 < 0.0) || (dVar31 < dVar34)) || (dVar34 < dVar32)) &&
         (((0.0 <= fVar28 || (dVar34 < dVar31)) || (dVar32 < dVar34)))) {
        uVar13 = 0x242;
        dVar31 = dVar34;
        goto LAB_00102c4c;
      }
    }
    else if (dVar30 + dVar30 < ABS(dVar32)) {
      uVar13 = 0x23e;
      goto LAB_00102c20;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void test_distributed_fft_3d_compare()
    {
    int s,p;
    MPI_Comm_size(MPI_COMM_WORLD, &p);
    MPI_Comm_rank(MPI_COMM_WORLD, &s);

    int nd = 3;
    int *pdim;
    pdim = (int *) malloc(sizeof(int)*nd);
    /* choose a decomposition */
    int r = powf(p,1.0/(double)nd)+0.5;
    int root = 1;
    while (root < r) root*=2;
    int ptot = 1;
    if (!s) printf("Processor grid: ");
    int i;
    for (i = 0; i < nd-1; ++i)
        {
        pdim[i] = (((ptot*root) > p) ? 1 : root);
        ptot *= pdim[i];
        if (!s) printf("%d x ",pdim[i]);
        }
    pdim[nd-1] = p/ptot;
    if (!s) printf("%d\n", pdim[nd-1]);

    /* determine processor index */
    int pidx[3];
    int idx = s;
    for (i = 2; i >= 0; --i)
        {
        pidx[i] = idx % pdim[i];
        idx /= pdim[i];
        }

    int *dim_glob;
    dim_glob = (int *) malloc(sizeof(int)*nd);

    // Do a pdim[0]*4 x pdim[1]* 8 x pdim[2] * 16 FFT (powers of two)
    int local_nx = 4;
    int local_ny = 8;
    int local_nz = 16;
    dim_glob[0] = pdim[0]*local_nx;
    dim_glob[1] = pdim[1]*local_ny;
    dim_glob[2] = pdim[2]*local_nz;

    for (i = 0; i < nd-1; ++i)
        if (!s) printf("%d x ",dim_glob[i]);
    if (!s) printf("%d matrix\n", dim_glob[nd-1]);

    kiss_fft_cpx *in_kiss;
    in_kiss = (kiss_fft_cpx *)malloc(sizeof(kiss_fft_cpx)*dim_glob[0]*dim_glob[1]*dim_glob[2]);

    srand(12345);

    float scale = dim_glob[0]*dim_glob[1]*dim_glob[2];
    /* assume 0.5 sig digit loss per addition/twiddling (empirical)*/
    float sig_digits = 7.0-0.5*logf(scale)/logf(2.0);
    double tol = powf(10.0,-sig_digits);
    double abs_tol = 1.0*tol;
    printf("Testing with %f sig digits, rel precision %f, abs precision %f\n", sig_digits,  tol, abs_tol);

    // fill table with complex random numbers in row major order
    int x,y,z;
    int nx = dim_glob[0];
    int ny = dim_glob[1];
    int nz = dim_glob[2];
    for (x = 0; x < dim_glob[0]; ++x)
        for (y = 0; y < dim_glob[1]; ++y)
            for (z = 0; z < dim_glob[2]; ++z)
                {
                // KISS has column-major storage
                in_kiss[z+nz*(y+ny*x)].r = (float)rand()/(float)RAND_MAX;
                in_kiss[z+nz*(y+ny*x)].i = (float)rand()/(float)RAND_MAX;
                }

    kiss_fft_cpx *out_kiss;
    out_kiss = (kiss_fft_cpx *)malloc(sizeof(kiss_fft_cpx)*dim_glob[0]*dim_glob[1]*dim_glob[2]);

    // construct forward transform
    kiss_fftnd_cfg cfg = kiss_fftnd_alloc(dim_glob,3,0,NULL,NULL);

    // carry out conventional FFT
    kiss_fftnd(cfg, in_kiss, out_kiss);

    // compare to distributed FFT
    cpx_t * in;
    in = (cpx_t *)malloc(sizeof(cpx_t)*local_nx*local_ny*local_nz);

    int x_local, y_local, z_local;
    for (x = 0; x < nx; ++x)
        for (y = 0; y < ny; ++y)
            for (z = 0; z < nz; ++z)
                {
                if (x>=pidx[0]*local_nx && x < (pidx[0]+1)*local_nx && 
                    y>=pidx[1]*local_ny && y < (pidx[1]+1)*local_ny &&
                    z>=pidx[2]*local_nz && z < (pidx[2]+1)*local_nz)
                    {
                    x_local = x - pidx[0]*local_nx;
                    y_local = y - pidx[1]*local_ny;
                    z_local = z - pidx[2]*local_nz;

                    RE(in[z_local+local_nz*(y_local+local_ny*x_local)]) =
                        in_kiss[z+nz*(y+ny*x)].r;
                    IM(in[z_local+local_nz*(y_local+local_ny*x_local)]) =
                        in_kiss[z+nz*(y+ny*x)].i;
                    }
                }

    cpx_t *out;
    out = (cpx_t *) malloc(local_nx*local_ny*local_nz*sizeof(cpx_t));

    dfft_plan plan;
    dfft_create_plan(&plan,3, dim_glob, NULL, NULL, pdim,pidx, 0, 0, 0, MPI_COMM_WORLD, proc_map);

    // forward transform
    dfft_execute(in, out, 0, plan);

    // do comparison
    int n_wave_local = local_nx * local_ny * local_nz;
    for (i = 0; i < n_wave_local; ++i)
        {

        x_local = i / local_ny / local_nz;
        y_local = (i - x_local*local_ny*local_nz)/local_nz;
        z_local = i % local_nz;

        x = pidx[0]*local_nx + x_local;
        y = pidx[1]*local_ny + y_local;
        z = pidx[2]*local_nz + z_local;

        double re = RE(out[i]);
        double im = IM(out[i]);
        double re_kiss = out_kiss[z+nz*(y+ny*x)].r;
        double im_kiss = out_kiss[z+nz*(y+ny*x)].i;  

        if (fabs(re_kiss) < abs_tol)
            {
            CHECK_SMALL(re,2*abs_tol);
            }
        else
            {
            CHECK_CLOSE(re,re_kiss, tol);
            }

        if (fabs(im_kiss) < abs_tol)
            {
            CHECK_SMALL(im,2*abs_tol);
            }
        else
            {
            CHECK_CLOSE(im, im_kiss, tol);
            }
        }
    free(in_kiss);
    free(out_kiss);
    free(out);
    free(in);
    free(dim_glob);
    dfft_destroy_plan(plan);
    }